

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cc
# Opt level: O3

bool anon_unknown.dwarf_2948be::write_stream(ostream *os,WriteOptions *options,Node *stream)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined1 extraout_AL;
  _Atomic_word _Var7;
  ostream *poVar8;
  string *psVar9;
  element_type *extraout_RAX;
  element_type *peVar10;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  element_type *extraout_RAX_02;
  element_type *extraout_RAX_03;
  element_type *extraout_RAX_04;
  element_type *extraout_RAX_05;
  element_type *peVar11;
  pointer psVar12;
  string_view sVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  string local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  Node local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  element_type *local_58;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  element_type *local_40;
  undefined1 *local_38;
  
  local_b8._M_dataplus._M_p = trieste::yaml::Documents;
  trieste::operator/((WFLookup *)local_d8,stream,(Token *)&local_b8);
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
  uVar3 = local_d8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00185a2e;
    }
    else {
      *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
    }
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
  }
LAB_00185a2e:
  peVar11 = (element_type *)
            (((Nodes *)(uVar3 + 0x58))->
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  peVar10 = (element_type *)
            (((Nodes *)(uVar3 + 0x58))->
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_40 = peVar10;
  if (peVar11 != peVar10) {
    bVar2 = 0;
    do {
      local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar11->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
           super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_60 = (peVar11->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                 super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_60 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = local_60;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_60->_M_use_count = local_60->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_60->_M_use_count = local_60->_M_use_count + 1;
            UNLOCK();
            goto LAB_00185aad;
          }
        }
        else {
          local_60->_M_use_count = local_60->_M_use_count + 1;
        }
        local_60->_M_use_count = local_60->_M_use_count + 1;
      }
LAB_00185aad:
      local_b8._M_dataplus._M_p = trieste::yaml::Directives;
      trieste::operator/((WFLookup *)local_d8,&local_90,(Token *)&local_b8);
      uVar3 = local_d8._8_8_;
      local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00185b0d;
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
LAB_00185b0d:
      psVar12 = (((Nodes *)(uVar3 + 0x58))->
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (((Nodes *)(uVar3 + 0x58))->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((!(bool)(~bVar2 & 1 | psVar12 == psVar1)) && (options->canonical == true)) {
        do {
          peVar10 = (psVar12->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          this = (psVar12->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this->_M_use_count = this->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded == '\0') {
                LOCK();
                this->_M_use_count = this->_M_use_count + 1;
                UNLOCK();
                goto LAB_00185b67;
              }
              _Var7 = this->_M_use_count;
            }
            else {
              _Var7 = this->_M_use_count + 1;
              this->_M_use_count = _Var7;
            }
            this->_M_use_count = _Var7 + 1;
          }
LAB_00185b67:
          if ((peVar10->type_).def == (TokenDef *)&trieste::yaml::VersionDirective) {
            sVar13 = trieste::Location::view(&peVar10->location_);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (os,sVar13._M_str,sVar13._M_len);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,(options->newline)._M_dataplus._M_p,
                       (options->newline)._M_string_length);
          }
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          psVar12 = psVar12 + 1;
        } while (psVar12 != psVar1);
      }
      local_b8._M_dataplus._M_p = &trieste::yaml::Value;
      trieste::operator/((WFLookup *)local_d8,&local_90,(Token *)&local_b8);
      uVar3 = local_c8._0_8_;
      peVar10 = (element_type *)local_d8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00185c1c;
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
LAB_00185c1c:
      local_b8._M_dataplus._M_p = (pointer)&trieste::yaml::DocumentStart;
      trieste::operator/((WFLookup *)local_d8,&local_90,(Token *)&local_b8);
      uVar4 = local_d8._8_8_;
      local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00185c7e;
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
LAB_00185c7e:
      local_b8._M_dataplus._M_p = (pointer)&trieste::yaml::DocumentEnd;
      trieste::operator/((WFLookup *)local_d8,&local_90,(Token *)&local_b8);
      local_68 = (element_type *)local_d8._8_8_;
      local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
          UNLOCK();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00185ce8;
        }
        else {
          *(_Atomic_word *)(local_c8._0_8_ + 8) = *(_Atomic_word *)(local_c8._0_8_ + 8) + 1;
        }
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_);
      }
LAB_00185ce8:
      if (options->canonical == true) {
        if (((Token *)((long)peVar10 + 0x10))->def == (TokenDef *)trieste::yaml::Empty) {
          if ((local_68->location_).len == 0) {
            local_38 = trieste::yaml::Null;
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            local_b8.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
            local_b8._M_string_length = 4;
            local_b8.field_2._M_allocated_capacity._4_4_ =
                 local_b8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            trieste::SourceDef::synthetic((SourceDef *)local_d8,&local_b8);
            local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_c8._8_8_ = local_b8._M_string_length;
            trieste::NodeDef::create
                      ((NodeDef *)&stack0xffffffffffffffa8,(Token *)&stack0xffffffffffffffc8,
                       (Location *)local_d8);
            if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
            peVar10 = local_58;
            local_e0 = _Stack_50._M_pi;
            local_58 = (element_type *)0x0;
            _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3),
               _Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,
                              CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                                       local_b8.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          else {
            local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
          }
        }
        else {
          local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
        }
LAB_00185e23:
        std::__ostream_insert<char,std::char_traits<char>>(os,"---",3);
        local_d8._0_8_ = trieste::yaml::Mapping;
        local_d8._8_8_ = trieste::yaml::FlowMapping;
        local_c8._0_8_ = trieste::yaml::Sequence;
        local_c8._8_8_ = trieste::yaml::FlowSequence;
        psVar9 = (string *)
                 std::
                 __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                           (local_d8,&local_b8,&peVar10->type_);
        if ((psVar9 == &local_b8) ||
           ((peVar10->children).
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (peVar10->children).
            super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          if ((peVar10->type_).def != (TokenDef *)trieste::yaml::Empty) {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(options->newline)._M_dataplus._M_p,(options->newline)._M_string_length);
        }
      }
      else {
        local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
        if (((Location *)(uVar4 + 0x18))->len != 0) goto LAB_00185e23;
      }
      local_d8._0_8_ = (Wellformed *)0x0;
      local_d8._8_8_ = (element_type *)0x0;
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
        }
      }
      local_b8._M_dataplus._M_p = (pointer)peVar10;
      local_b8._M_string_length = (size_type)local_e0;
      bVar5 = write_value(os,options,(Spaces *)local_d8,(Node *)&local_b8);
      peVar10 = (element_type *)(ulong)bVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
        peVar10 = extraout_RAX;
      }
      if ((!bVar5) &&
         (((local_68->location_).len != 0 || (peVar10 = local_68, (options->emit_docend & 1U) != 0))
         )) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"...",3);
        peVar10 = (element_type *)
                  std::__ostream_insert<char,std::char_traits<char>>
                            (os,(options->newline)._M_dataplus._M_p,
                             (options->newline)._M_string_length);
      }
      if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
        peVar10 = extraout_RAX_00;
      }
      if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        peVar10 = extraout_RAX_01;
      }
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
        peVar10 = extraout_RAX_02;
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        peVar10 = extraout_RAX_03;
      }
      if (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        peVar10 = extraout_RAX_04;
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        peVar10 = extraout_RAX_05;
      }
      peVar11 = (element_type *)&peVar11->type_;
      bVar2 = 1;
    } while (peVar11 != local_40);
  }
  uVar6 = SUB81(peVar10,0);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    uVar6 = extraout_AL;
  }
  return (bool)uVar6;
}

Assistant:

bool write_stream(std::ostream& os, WriteOptions& options, Node stream)
  {
    Node documents = stream / Documents;
    bool not_first = false;
    for (auto document : *documents)
    {
      write_document(os, options, document, not_first);
      not_first = true;
    }
    return false;
  }